

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&>::
MatchAndExplain(AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this,
               FieldDescriptor **x,MatchResultListener *listener)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *this_00;
  ulong uVar4;
  undefined1 local_260 [8];
  string result;
  string local_218;
  undefined1 local_1e8 [8];
  StringMatchResultListener slistener;
  size_t i;
  string no_match_result;
  MatchResultListener *listener_local;
  FieldDescriptor **x_local;
  AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this_local;
  
  no_match_result.field_2._8_8_ = listener;
  std::__cxx11::string::string((string *)&i);
  slistener._400_8_ = 0;
  while( true ) {
    uVar1 = slistener._400_8_;
    sVar3 = std::
            vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
            ::size(&this->matchers_);
    if (sVar3 <= (ulong)uVar1) break;
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1e8);
    this_00 = &std::
               vector<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
               ::operator[](&this->matchers_,slistener._400_8_)->
               super_MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>;
    bVar2 = MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::MatchAndExplain
                      (this_00,x,(MatchResultListener *)local_1e8);
    uVar1 = no_match_result.field_2._8_8_;
    if (bVar2) {
      StringMatchResultListener::str_abi_cxx11_(&local_218,(StringMatchResultListener *)local_1e8);
      MatchResultListener::operator<<((MatchResultListener *)uVar1,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        StringMatchResultListener::str_abi_cxx11_
                  ((string *)local_260,(StringMatchResultListener *)local_1e8);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&i,", and ");
          std::__cxx11::string::operator+=((string *)&i,(string *)local_260);
        }
        std::__cxx11::string::~string((string *)local_260);
      }
      else {
        StringMatchResultListener::str_abi_cxx11_
                  ((string *)((long)&result.field_2 + 8),(StringMatchResultListener *)local_1e8);
        std::__cxx11::string::operator=((string *)&i,(string *)(result.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
      }
      bVar2 = false;
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1e8);
    if (bVar2) goto LAB_006d638d;
    slistener._400_8_ = slistener._400_8_ + 1;
  }
  MatchResultListener::operator<<
            ((MatchResultListener *)no_match_result.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  this_local._7_1_ = 0;
LAB_006d638d:
  std::__cxx11::string::~string((string *)&i);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MatchAndExplain(const T& x,
                       MatchResultListener* listener) const override {
    std::string no_match_result;

    // If either matcher1_ or matcher2_ matches x, we just need to
    // explain why *one* of them matches.
    for (size_t i = 0; i < matchers_.size(); ++i) {
      StringMatchResultListener slistener;
      if (matchers_[i].MatchAndExplain(x, &slistener)) {
        *listener << slistener.str();
        return true;
      } else {
        if (no_match_result.empty()) {
          no_match_result = slistener.str();
        } else {
          std::string result = slistener.str();
          if (!result.empty()) {
            no_match_result += ", and ";
            no_match_result += result;
          }
        }
      }
    }

    // Otherwise we need to explain why *both* of them fail.
    *listener << no_match_result;
    return false;
  }